

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O0

void update_frame_buffers(AV1Decoder *pbi,int frame_decoded)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  RefCntBuffer *buf;
  int in_ESI;
  long in_RDI;
  BufferPool *pool;
  AV1_COMMON *cm;
  int mask;
  int ref_index;
  BufferPool *pool_00;
  uint local_14;
  int local_10;
  
  local_10 = 0;
  buf = (RefCntBuffer *)(in_RDI + 0x3b60);
  pool_00 = *(BufferPool **)(in_RDI + 0x9e50);
  if (in_ESI == 0) {
    lock_buffer_pool((BufferPool *)0x1b5681);
    decrease_ref_count(buf,pool_00);
    unlock_buffer_pool((BufferPool *)0x1b569f);
  }
  else {
    lock_buffer_pool((BufferPool *)0x1b54b9);
    if (*(int *)(in_RDI + 0x58dc0) == 0) {
      for (local_14 = buf->display_order_hint; local_14 != 0; local_14 = (int)local_14 >> 1) {
        if ((local_14 & 1) != 0) {
          decrease_ref_count(buf,pool_00);
          *(undefined8 *)(buf->global_motion[3].wmmat + (long)local_10 * 2 + 8) =
               *(undefined8 *)((buf->seg).feature_mask + 3);
          piVar3 = *(int **)((buf->seg).feature_mask + 3);
          *piVar3 = *piVar3 + 1;
        }
        local_10 = local_10 + 1;
      }
    }
    iVar1._0_1_ = buf->global_motion[5].wmtype;
    iVar1._1_1_ = buf->global_motion[5].invalid;
    iVar1._2_2_ = *(undefined2 *)&buf->global_motion[5].field_0x22;
    if ((iVar1 == 0) &&
       (iVar2._0_2_ = buf->global_motion[5].alpha, iVar2._2_2_ = buf->global_motion[5].beta,
       iVar2 == 0)) {
      decrease_ref_count(buf,pool_00);
    }
    else if (*(int *)(in_RDI + 0x58d50) == 0) {
      if (*(long *)(in_RDI + 0x58d78) != 0) {
        decrease_ref_count(buf,pool_00);
      }
      *(undefined8 *)(in_RDI + 0x58d58) = *(undefined8 *)((buf->seg).feature_mask + 3);
      *(undefined8 *)(in_RDI + 0x58d78) = 1;
    }
    else if (*(ulong *)(in_RDI + 0x58d78) < 4) {
      *(undefined8 *)(in_RDI + 0x58d58 + *(long *)(in_RDI + 0x58d78) * 8) =
           *(undefined8 *)((buf->seg).feature_mask + 3);
      *(long *)(in_RDI + 0x58d78) = *(long *)(in_RDI + 0x58d78) + 1;
    }
    else {
      *(undefined4 *)(*(long *)((buf->seg).feature_mask + 3) + 0x59c) = 1;
      decrease_ref_count(buf,pool_00);
      *(undefined4 *)(in_RDI + 0x5ff08) = 5;
    }
    unlock_buffer_pool((BufferPool *)0x1b5676);
  }
  (buf->seg).feature_mask[3] = 0;
  (buf->seg).feature_mask[4] = 0;
  if (*(int *)(in_RDI + 0x58dc0) == 0) {
    for (local_10 = 0; local_10 < 7; local_10 = local_10 + 1) {
      *(uint *)((long)(buf->global_motion + -1) + (long)local_10 * 4) = 0xffffffff;
    }
  }
  return;
}

Assistant:

static void update_frame_buffers(AV1Decoder *pbi, int frame_decoded) {
  int ref_index = 0, mask;
  AV1_COMMON *const cm = &pbi->common;
  BufferPool *const pool = cm->buffer_pool;

  if (frame_decoded) {
    lock_buffer_pool(pool);

    // In ext-tile decoding, the camera frame header is only decoded once. So,
    // we don't update the references here.
    if (!pbi->camera_frame_header_ready) {
      // The following for loop needs to release the reference stored in
      // cm->ref_frame_map[ref_index] before storing a reference to
      // cm->cur_frame in cm->ref_frame_map[ref_index].
      for (mask = cm->current_frame.refresh_frame_flags; mask; mask >>= 1) {
        if (mask & 1) {
          decrease_ref_count(cm->ref_frame_map[ref_index], pool);
          cm->ref_frame_map[ref_index] = cm->cur_frame;
          ++cm->cur_frame->ref_count;
        }
        ++ref_index;
      }
    }

    if (cm->show_existing_frame || cm->show_frame) {
      if (pbi->output_all_layers) {
        // Append this frame to the output queue
        if (pbi->num_output_frames >= MAX_NUM_SPATIAL_LAYERS) {
          // We can't store the new frame anywhere, so drop it and return an
          // error
          cm->cur_frame->buf.corrupted = 1;
          decrease_ref_count(cm->cur_frame, pool);
          pbi->error.error_code = AOM_CODEC_UNSUP_BITSTREAM;
        } else {
          pbi->output_frames[pbi->num_output_frames] = cm->cur_frame;
          pbi->num_output_frames++;
        }
      } else {
        // Replace any existing output frame
        assert(pbi->num_output_frames == 0 || pbi->num_output_frames == 1);
        if (pbi->num_output_frames > 0) {
          decrease_ref_count(pbi->output_frames[0], pool);
        }
        pbi->output_frames[0] = cm->cur_frame;
        pbi->num_output_frames = 1;
      }
    } else {
      decrease_ref_count(cm->cur_frame, pool);
    }

    unlock_buffer_pool(pool);
  } else {
    // Nothing was decoded, so just drop this frame buffer
    lock_buffer_pool(pool);
    decrease_ref_count(cm->cur_frame, pool);
    unlock_buffer_pool(pool);
  }
  cm->cur_frame = NULL;

  if (!pbi->camera_frame_header_ready) {
    // Invalidate these references until the next frame starts.
    for (ref_index = 0; ref_index < INTER_REFS_PER_FRAME; ref_index++) {
      cm->remapped_ref_idx[ref_index] = INVALID_IDX;
    }
  }
}